

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Projector.h
# Opt level: O3

void __thiscall Projector::LoadSlice(Projector *this,string *imageLoc,ofstream *myFile)

{
  char *pcVar1;
  long lVar2;
  thread t_display;
  thread local_90;
  Projector *local_88;
  code *local_80;
  undefined8 local_78;
  
  std::__cxx11::string::_M_assign((string *)&this->CurrentImageLoc);
  cv::imread((string *)&local_80,(int)imageLoc);
  cv::Mat::operator=(&this->CurrentImage,(Mat *)&local_80);
  cv::Mat::~Mat((Mat *)&local_80);
  local_80 = DisplayCurrentSlice;
  local_78 = 0;
  local_88 = this;
  std::thread::thread<void(Projector::*)(),Projector*,void>
            (&local_90,(offset_in_Projector_to_subr *)&local_80,&local_88);
  std::thread::detach();
  if (*(long *)&this->field_0x38 == 0) {
    pcVar1 = "No Image data!";
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"No Image data!",0xe);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
    std::ostream::put('P');
    lVar2 = 0xe;
    std::ostream::flush();
  }
  else {
    pcVar1 = "New Image loaded";
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"New Image loaded",0x10);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
    std::ostream::put('P');
    lVar2 = 0x10;
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)myFile,pcVar1,lVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)myFile + -0x18) + (char)myFile);
  std::ostream::put((char)myFile);
  std::ostream::flush();
  if (local_90._M_id._M_thread == 0) {
    return;
  }
  std::terminate();
}

Assistant:

void Projector::LoadSlice(string imageLoc, ofstream &myFile)
{

	CurrentImageLoc = imageLoc;
	CurrentImage = imread(imageLoc, 1);

	//Display image in seperate thread
	thread t_display(&Projector::DisplayCurrentSlice, this);
	t_display.detach();

	if (!CurrentImage.data)
	{
		cout << "No Image data!" << endl;
		myFile << "No Image data!" << endl;

	}
	else
	{
		cout << "New Image loaded" << endl;
		myFile << "New Image loaded" << endl;
	}


}